

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::save_load_example
               (example *ec,io_buf *model_file,bool *read,bool *text,stringstream *msg,int *oas)

{
  stringstream *psVar1;
  polylabel *this;
  v_array<char> *this_00;
  features *this_01;
  byte bVar2;
  uint uVar3;
  ostream *poVar4;
  uint32_t i;
  ulong uVar5;
  size_t feat_size;
  size_t namespace_size;
  size_t tag_number;
  byte *local_40;
  byte *local_38;
  
  psVar1 = msg + 0x10;
  local_40 = (byte *)oas;
  poVar4 = std::operator<<((ostream *)psVar1,"num_features");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed(model_file,(char *)&ec->num_features,8,"",*read,msg,*text);
  poVar4 = std::operator<<((ostream *)psVar1,"total_sum_features");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,ec->total_sum_feat_sq);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed(model_file,(char *)&ec->total_sum_feat_sq,4,"",*read,msg,*text);
  poVar4 = std::operator<<((ostream *)psVar1,"example_weight");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,ec->weight);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed(model_file,(char *)&ec->weight,4,"",*read,msg,*text);
  poVar4 = std::operator<<((ostream *)psVar1,"loss");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,ec->loss);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed(model_file,(char *)&ec->loss,4,"",*read,msg,*text);
  poVar4 = std::operator<<((ostream *)psVar1,"ft_offset");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed
            (model_file,(char *)&(ec->super_example_predict).ft_offset,8,"",*read,msg,*text);
  if (*(int *)local_40 == 0) {
    poVar4 = std::operator<<((ostream *)psVar1,"multiclass_label");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," ");
    bin_text_read_write_fixed(model_file,&(ec->l).empty,4,"",*read,msg,*text);
    poVar4 = std::operator<<((ostream *)psVar1,"multiclass_weight");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ec->l).simple.weight);
    std::operator<<(poVar4," ");
    bin_text_read_write_fixed(model_file,(char *)((long)&ec->l + 4),4,"",*read,msg,*text);
  }
  else {
    this = &ec->l;
    tag_number = (long)(ec->l).cs.costs._end - (long)(ec->l).cs.costs._begin >> 2;
    poVar4 = std::operator<<((ostream *)psVar1,"label_size");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," ");
    bin_text_read_write_fixed(model_file,(char *)&tag_number,8,"",*read,msg,*text);
    if (*read != false) {
      v_array<unsigned_int>::clear((v_array<unsigned_int> *)&this->simple);
      for (uVar5 = 0; uVar5 < tag_number; uVar5 = (ulong)((int)uVar5 + 1)) {
        namespace_size = namespace_size & 0xffffffff00000000;
        v_array<unsigned_int>::push_back
                  ((v_array<unsigned_int> *)&this->simple,(uint *)&namespace_size);
      }
    }
    for (uVar3 = 0; uVar3 < tag_number; uVar3 = uVar3 + 1) {
      poVar4 = std::operator<<((ostream *)psVar1,"ec_label");
      poVar4 = std::operator<<(poVar4," = ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4," ");
      bin_text_read_write_fixed
                (model_file,(char *)(&((this->cs).costs._begin)->x + uVar3),4,"",*read,msg,*text);
    }
  }
  this_00 = &ec->tag;
  tag_number = (long)(ec->tag)._end - (long)(ec->tag)._begin;
  poVar4 = std::operator<<((ostream *)psVar1,"tags");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed(model_file,(char *)&tag_number,8,"",*read,msg,*text);
  if (*read != false) {
    v_array<char>::clear(this_00);
    for (uVar5 = 0; uVar5 < tag_number; uVar5 = (ulong)((int)uVar5 + 1)) {
      namespace_size = CONCAT71(namespace_size._1_7_,0x61);
      v_array<char>::push_back(this_00,(char *)&namespace_size);
    }
  }
  for (uVar3 = 0; uVar5 = (ulong)uVar3, uVar5 < tag_number; uVar3 = uVar3 + 1) {
    poVar4 = std::operator<<((ostream *)psVar1,"tag");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::operator<<(poVar4,this_00->_begin[uVar5]);
    std::operator<<(poVar4," ");
    bin_text_read_write_fixed(model_file,this_00->_begin + uVar5,1,"",*read,msg,*text);
  }
  namespace_size =
       (long)(ec->super_example_predict).indices._end -
       (long)(ec->super_example_predict).indices._begin;
  poVar4 = std::operator<<((ostream *)psVar1,"namespaces");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed(model_file,(char *)&namespace_size,8,"",*read,msg,*text);
  if (*read != false) {
    v_array<unsigned_char>::delete_v((v_array<unsigned_char> *)ec);
    for (uVar5 = 0; uVar5 < namespace_size; uVar5 = (ulong)((int)uVar5 + 1)) {
      feat_size = feat_size & 0xffffffffffffff00;
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,(uchar *)&feat_size);
    }
  }
  for (uVar3 = 0; uVar5 = (ulong)uVar3, uVar5 < namespace_size; uVar3 = uVar3 + 1) {
    poVar4 = std::operator<<((ostream *)psVar1,"namespace_index");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::operator<<(poVar4,(ec->super_example_predict).indices._begin[uVar5]);
    std::operator<<(poVar4," ");
    bin_text_read_write_fixed
              (model_file,(char *)((ec->super_example_predict).indices._begin + uVar5),1,"",*read,
               msg,*text);
  }
  local_38 = (ec->super_example_predict).indices._end;
  for (local_40 = (ec->super_example_predict).indices._begin; local_40 != local_38;
      local_40 = local_40 + 1) {
    bVar2 = *local_40;
    this_01 = (ec->super_example_predict).feature_space + bVar2;
    feat_size = (long)(ec->super_example_predict).feature_space[bVar2].values._end -
                (long)(ec->super_example_predict).feature_space[bVar2].values._begin >> 2;
    poVar4 = std::operator<<((ostream *)psVar1,"features_");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," ");
    bin_text_read_write_fixed(model_file,(char *)&feat_size,8,"",*read,msg,*text);
    if (*read != false) {
      features::clear(this_01);
      (this_01->values).end_array = (float *)0x0;
      (this_01->values).erase_count = 0;
      (this_01->values)._begin = (float *)0x0;
      (this_01->values)._end = (float *)0x0;
      (this_01->indicies)._begin = (unsigned_long *)0x0;
      (this_01->indicies)._end = (unsigned_long *)0x0;
      (this_01->indicies).end_array = (unsigned_long *)0x0;
      (this_01->indicies).erase_count = 0;
      for (uVar5 = 0; uVar5 < feat_size; uVar5 = (ulong)((int)uVar5 + 1)) {
        features::push_back(this_01,0.0,0);
      }
    }
    for (uVar3 = 0; uVar5 = (ulong)uVar3, uVar5 < feat_size; uVar3 = uVar3 + 1) {
      poVar4 = std::operator<<((ostream *)psVar1,"value");
      poVar4 = std::operator<<(poVar4," = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this_01->values)._begin[uVar5]);
      std::operator<<(poVar4," ");
      bin_text_read_write_fixed
                (model_file,(char *)((this_01->values)._begin + uVar5),4,"",*read,msg,*text);
    }
    for (uVar3 = 0; uVar3 < feat_size; uVar3 = uVar3 + 1) {
      poVar4 = std::operator<<((ostream *)psVar1,"index");
      poVar4 = std::operator<<(poVar4," = ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4," ");
      bin_text_read_write_fixed
                (model_file,(char *)((this_01->indicies)._begin + uVar3),8,"",*read,msg,*text);
    }
  }
  return;
}

Assistant:

void save_load_example(example* ec, io_buf& model_file, bool& read, bool& text, stringstream& msg, int& oas)
    {   //deal with tag
        //deal with labels:
	    writeit(ec->num_features, "num_features");
	    writeit(ec->total_sum_feat_sq, "total_sum_features");
	    writeit(ec->weight, "example_weight");
	    writeit(ec->loss, "loss");
	    writeit(ec->ft_offset, "ft_offset");
        if(oas == false){ //multi-class
            writeit(ec->l.multi.label, "multiclass_label");
            writeit(ec->l.multi.weight, "multiclass_weight");
        }
        else{ //multi-label
            writeitvar(ec->l.multilabels.label_v.size(), "label_size", label_size);
            if (read){
            	ec->l.multilabels.label_v.clear();
            	for (uint32_t i = 0; i < label_size; i++)
                	ec->l.multilabels.label_v.push_back(0);
            }
            for (uint32_t i = 0; i < label_size; i++)
                writeit(ec->l.multilabels.label_v[i], "ec_label");
        }

        writeitvar(ec->tag.size(), "tags", tag_number);
        if (read){
            ec->tag.clear();
            for (uint32_t i = 0; i < tag_number; i++)
                ec->tag.push_back('a');
        }
        for (uint32_t i = 0; i < tag_number; i++)
            writeit(ec->tag[i], "tag");
        
        //deal with tag:
        writeitvar(ec->indices.size(), "namespaces", namespace_size);
        if (read){
            ec->indices.delete_v();
            for (uint32_t i = 0; i< namespace_size; i++){
                ec->indices.push_back('\0');
            }
        }
        for(uint32_t i = 0; i < namespace_size; i++)
            writeit(ec->indices[i], "namespace_index");

        //deal with features
        for (namespace_index nc: ec->indices){
            features* fs = &ec->feature_space[nc];
            writeitvar(fs->size(), "features_", feat_size);
            if (read){
                fs->clear();
                fs->values = v_init<feature_value>();
                fs->indicies = v_init<feature_index>();
                for (uint32_t f_i = 0; f_i < feat_size; f_i++){
                    fs->push_back(0, 0);
                }
            }
            for (uint32_t f_i = 0; f_i < feat_size; f_i++)
                writeit(fs->values[f_i], "value");
            for (uint32_t f_i = 0; f_i < feat_size; f_i++)
                writeit(fs->indicies[f_i], "index");
        }
    }